

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.h
# Opt level: O2

void __thiscall upb::generator::DefPoolPair::~DefPoolPair(DefPoolPair *this)

{
  std::unique_ptr<upb_DefPool,_void_(*)(upb_DefPool_*)>::~unique_ptr(&(this->pool64_).ptr_);
  std::unique_ptr<upb_DefPool,_void_(*)(upb_DefPool_*)>::~unique_ptr
            ((unique_ptr<upb_DefPool,_void_(*)(upb_DefPool_*)> *)this);
  return;
}

Assistant:

DefPoolPair() {
    pool32_._SetPlatform(kUpb_MiniTablePlatform_32Bit);
    pool64_._SetPlatform(kUpb_MiniTablePlatform_64Bit);
  }